

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_type_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *data;
  long *plVar1;
  CURLcode CVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  ftpstate instate_00;
  char *pcVar6;
  char *pcVar7;
  char *local_30;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(conn->data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if (ftpcode != 200) {
    Curl_infof(conn->data,"Got a %03d response code instead of the assumed 200\n");
  }
  switch(instate) {
  case FTP_TYPE:
    CVar2 = ftp_state_size(conn);
    return CVar2;
  case FTP_LIST_TYPE:
    data = conn->data;
    if (((data->set).ftp_filemethod == FTPFILE_NOCWD) &&
       (plVar1 = (long *)(data->req).protop, *plVar1 != 0)) {
      local_30 = (char *)0x0;
      CVar2 = Curl_urldecode(data,(char *)*plVar1,0,&local_30,(size_t *)0x0,REJECT_CTRL);
      pcVar7 = local_30;
      pcVar3 = (char *)0x0;
      if (CVar2 == CURLE_OK) {
        pcVar3 = strrchr(local_30,0x2f);
        if (pcVar3 == (char *)0x0) {
          (*Curl_cfree)(pcVar7);
          pcVar3 = (char *)0x0;
        }
        else {
          lVar4 = 1;
          if ((long)pcVar3 - (long)pcVar7 != 0) {
            lVar4 = (long)pcVar3 - (long)pcVar7;
          }
          pcVar7[lVar4] = '\0';
          pcVar3 = pcVar7;
        }
      }
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    else {
      pcVar3 = (char *)0x0;
    }
    pcVar7 = (data->set).str[6];
    if ((pcVar7 == (char *)0x0) && (pcVar7 = "NLST", ((data->set).field_0x979 & 0x20) == 0)) {
      pcVar7 = "LIST";
    }
    pcVar6 = " ";
    pcVar5 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar6 = "";
      pcVar5 = "";
    }
    pcVar7 = curl_maprintf("%s%s%s",pcVar7,pcVar6,pcVar5);
    (*Curl_cfree)(pcVar3);
    if (pcVar7 == (char *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar7);
      (*Curl_cfree)(pcVar7);
      if (CVar2 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_LIST;
      }
    }
    break;
  case FTP_RETR_TYPE:
    instate_00 = FTP_RETR_PREQUOTE;
    goto LAB_0011902d;
  case FTP_STOR_TYPE:
    instate_00 = FTP_STOR_PREQUOTE;
LAB_0011902d:
    CVar2 = ftp_state_quote(conn,true,instate_00);
    return CVar2;
  default:
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_type_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200\n",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(conn);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(conn);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(conn);

  return result;
}